

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QMimeGlobPattern>::moveAppend
          (QGenericArrayOps<QMimeGlobPattern> *this,QMimeGlobPattern *b,QMimeGlobPattern *e)

{
  qsizetype *pqVar1;
  QMimeGlobPattern *pQVar2;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QMimeGlobPattern>).ptr;
    for (; b < e; b = b + 1) {
      QMimeGlobPattern::QMimeGlobPattern
                (pQVar2 + (this->super_QArrayDataPointer<QMimeGlobPattern>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QMimeGlobPattern>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }